

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::mouseMoveEvent(QListView *this,QMouseEvent *e)

{
  QListViewPrivate *this_00;
  QWidget *this_01;
  QRect QVar1;
  QRect QVar2;
  State SVar3;
  int iVar4;
  int iVar5;
  QStyle *pQVar6;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  QRect local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)->
       widget_attributes & 0x8000) != 0) {
    this_00 = *(QListViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QAbstractItemView::mouseMoveEvent((QAbstractItemView *)this,e);
    SVar3 = QAbstractItemView::state((QAbstractItemView *)this);
    QVar2.x2.m_i = local_48._8_4_;
    QVar2.y2.m_i = local_48._12_4_;
    QVar2.x1.m_i = local_48._0_4_;
    QVar2.y1.m_i = local_48._4_4_;
    QVar1.x2.m_i = local_48._8_4_;
    QVar1.y2.m_i = local_48._12_4_;
    QVar1.x1.m_i = local_48._0_4_;
    QVar1.y1.m_i = local_48._4_4_;
    if (((SVar3 == DragSelectingState) &&
        (local_48._0_16_ = (undefined1  [16])QVar1, this_00->showElasticBand == true)) &&
       (local_48._0_16_ = (undefined1  [16])QVar2,
       SingleSelection < (this_00->super_QAbstractItemViewPrivate).selectionMode)) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      auVar8 = QEventPoint::position();
      uVar9 = extraout_XMM1_Qb;
      uVar10 = extraout_XMM0_Qb;
      iVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b0))(this);
      iVar5 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b8))(this);
      local_48._0_8_ = (this_00->super_QAbstractItemViewPrivate).pressedPosition;
      auVar7._0_8_ = (double)((ulong)auVar8._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar8._0_8_;
      auVar7._8_8_ = (double)((ulong)auVar8._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                     auVar8._8_8_;
      auVar7 = minpd(_DAT_0066f5d0,auVar7);
      auVar7 = maxpd(auVar7,_DAT_0066f5e0);
      local_48._8_4_ = iVar4 + (int)auVar7._0_8_;
      local_48._12_4_ = iVar5 + (int)auVar7._8_8_;
      local_48._0_16_ = QRect::normalized();
      pQVar6 = QWidget::style((QWidget *)this);
      iVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))
                        (pQVar6,5,0,0,*(long *)pQVar6,in_R9,auVar8._8_8_,uVar9,auVar8._0_8_,uVar10);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      auVar7 = QRect::operator|((QRect *)local_48,&this_00->elasticBand);
      local_58._0_4_ = auVar7._0_4_ + iVar4 * -2;
      puStack_50._0_4_ = auVar7._8_4_ + iVar4 * 2;
      local_58._4_4_ = auVar7._4_4_ + iVar4 * -2;
      puStack_50._4_4_ = auVar7._12_4_ + iVar4 * 2;
      this_01 = (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
      local_68 = QListViewPrivate::mapToViewport(this_00,(QRect *)&local_58,true);
      QWidget::update(this_01,&local_68);
      (this_00->elasticBand).x1 = (Representation)local_48._0_4_;
      (this_00->elasticBand).y1 = (Representation)local_48._4_4_;
      (this_00->elasticBand).x2 = (Representation)local_48._8_4_;
      (this_00->elasticBand).y2 = (Representation)local_48._12_4_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::mouseMoveEvent(QMouseEvent *e)
{
    if (!isVisible())
        return;
    Q_D(QListView);
    QAbstractItemView::mouseMoveEvent(e);
    if (state() == DragSelectingState
        && d->showElasticBand
        && d->selectionMode != SingleSelection
        && d->selectionMode != NoSelection) {
        QRect rect(d->pressedPosition, e->position().toPoint() + QPoint(horizontalOffset(), verticalOffset()));
        rect = rect.normalized();
        const int margin = 2 * style()->pixelMetric(QStyle::PM_DefaultFrameWidth);
        const QRect viewPortRect = rect.united(d->elasticBand)
                                       .adjusted(-margin, -margin, margin, margin);
        d->viewport->update(d->mapToViewport(viewPortRect));
        d->elasticBand = rect;
    }
}